

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TlsDirWrapper.cpp
# Opt level: O1

void * __thiscall TlsEntryWrapper::getPtr(TlsEntryWrapper *this)

{
  TlsDirWrapper *pTVar1;
  bool isOk;
  
  pTVar1 = this->parentDir;
  if (pTVar1 != (TlsDirWrapper *)0x0) {
    (*(pTVar1->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
      super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x1c])
              (pTVar1,3,0xffffffffffffffff);
  }
  return (void *)0x0;
}

Assistant:

void* TlsEntryWrapper::getPtr()
{
    if (!this->parentDir) return nullptr;

    bool isOk = false;
    const offset_t firstVA = static_cast<offset_t>(this->parentDir->getNumValue(TlsDirWrapper::CALLBACKS_ADDR, &isOk));
    if (!isOk || (firstVA == 0)) return nullptr;

    const offset_t firstRaw = m_Exe->toRaw(firstVA, Executable::VA);
    if (firstRaw == INVALID_ADDR) {
        return nullptr;
    }

    const bufsize_t addrSize = this->parentDir->getFieldSize(TlsDirWrapper::CALLBACKS_ADDR);
    const offset_t myRaw = firstRaw + (addrSize * this->entryNum);
    BYTE *ptr  = m_Exe->getContentAt(myRaw, Executable::RAW, addrSize);
    return ptr;
}